

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O2

bool __thiscall
rtosc::UndoHistoryImpl::mergeEvent(UndoHistoryImpl *this,time_t now,char *msg,char *buf,size_t N)

{
  int iVar1;
  reference ppVar2;
  char *pcVar3;
  char *__s2;
  ulong uVar4;
  ulong __n;
  iterator *this_00;
  double dVar5;
  rtosc_arg_t local_68;
  rtosc_arg_t local_58;
  rtosc_arg_t local_48;
  
  if (this->history_pos == 0) {
    return false;
  }
  this_00 = &(this->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start;
  uVar4 = this->history_pos & 0xffffffff;
  while( true ) {
    uVar4 = uVar4 - 1;
    if ((int)(uint)uVar4 < 0) {
      return false;
    }
    __n = (ulong)((uint)uVar4 & 0x7fffffff);
    ppVar2 = std::
             _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
             ::operator[](this_00,__n);
    dVar5 = difftime(now,ppVar2->first);
    if (2.0 < dVar5) break;
    pcVar3 = getUndoAddress(msg);
    ppVar2 = std::
             _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
             ::operator[](this_00,__n);
    __s2 = getUndoAddress(ppVar2->second);
    iVar1 = strcmp(pcVar3,__s2);
    if (iVar1 == 0) {
      local_68 = rtosc_argument(msg,0);
      ppVar2 = std::
               _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
               ::operator[](this_00,__n);
      local_58 = rtosc_argument(ppVar2->second,1);
      local_48 = rtosc_argument(msg,2);
      pcVar3 = rtosc_argument_string(msg);
      rtosc_amessage(buf,N,msg,pcVar3,&local_68);
      ppVar2 = std::
               _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
               ::operator[](this_00,__n);
      if (ppVar2->second != (char *)0x0) {
        operator_delete__(ppVar2->second);
      }
      ppVar2 = std::
               _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
               ::operator[](this_00,__n);
      ppVar2->second = buf;
      ppVar2 = std::
               _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
               ::operator[](this_00,__n);
      ppVar2->first = now;
      return true;
    }
  }
  return false;
}

Assistant:

bool UndoHistoryImpl::mergeEvent(time_t now, const char *msg, char *buf, size_t N)
{
    if(history_pos == 0)
        return false;
    for(int i=history_pos-1; i>=0; --i) {
        if(difftime(now, history[i].first) > 2)
            break;
        if(!strcmp(getUndoAddress(msg),
                    getUndoAddress(history[i].second)))
        {
            //We can splice events together, merging them into one event
            rtosc_arg_t args[3];
            args[0] = rtosc_argument(msg, 0);
            args[1] = rtosc_argument(history[i].second,1);
            args[2] = rtosc_argument(msg, 2);

            rtosc_amessage(buf, N, msg, rtosc_argument_string(msg), args);

            delete [] history[i].second;
            history[i].second = buf;
            history[i].first = now;
            return true;
        }
    }
    return false;
}